

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mul-mat2.c
# Opt level: O0

void mul_mat_gq_5(void *src0,void *src1,float *dst,int m,int n,int k)

{
  int in_ECX;
  int in_R8D;
  int in_R9D;
  int ir1;
  int ir0;
  int nb;
  void *in_stack_00000278;
  void *in_stack_00000280;
  float *in_stack_00000288;
  int in_stack_00000294;
  int local_30;
  int local_2c;
  
  if (in_R9D % 0x40 == 0) {
    quantize_5_blocks_per_row(in_R9D);
    for (local_2c = 0; local_2c < in_ECX; local_2c = local_2c + 1) {
      for (local_30 = 0; local_30 < in_R8D; local_30 = local_30 + 1) {
        vec_dot_gq_5(in_stack_00000294,in_stack_00000288,in_stack_00000280,in_stack_00000278);
        quantize_5_row_size(0);
      }
      quantize_5_row_size(0);
      quantize_5_row_size(0);
    }
    return;
  }
  __assert_fail("k % QK == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat2.c"
                ,0x7c2,"void mul_mat_gq_5(const void *, const void *, float *, int, int, int)");
}

Assistant:

void mul_mat_gq_5(
    const void * src0,
    const void * src1, // transposed
         float * dst,
    int m, int n, int k) {
    assert(k % QK == 0);

    const int nb = quantize_5_blocks_per_row(k);

    for (int ir0 = 0; ir0 < m; ir0++) {
        for (int ir1 = 0; ir1 < n; ir1++) {
            vec_dot_gq_5(k, dst + ir1, src0, src1);
            src1 = (const char *) src1 + quantize_5_row_size(k);
        }
        src0 = (const char *) src0 +   quantize_5_row_size(k);
        src1 = (const char *) src1 - n*quantize_5_row_size(k);

        dst = (float *) dst + n;
    }
}